

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_common.h
# Opt level: O0

size_type __thiscall
sh_hashtable_settings<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_unsigned_long,_4>::
min_buckets(sh_hashtable_settings<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_unsigned_long,_4>
            *this,size_type num_elts,size_type min_buckets_wanted)

{
  length_error *this_00;
  ulong uVar1;
  bool bVar2;
  float fVar3;
  float local_44;
  ulong local_30;
  size_type sz;
  float enlarge;
  size_type min_buckets_wanted_local;
  size_type num_elts_local;
  sh_hashtable_settings<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_unsigned_long,_4>
  *this_local;
  
  fVar3 = enlarge_factor(this);
  local_30 = 4;
  while( true ) {
    bVar2 = true;
    if (min_buckets_wanted <= local_30) {
      local_44 = (float)local_30;
      uVar1 = (ulong)(local_44 * fVar3);
      bVar2 = (uVar1 | (long)(local_44 * fVar3 - 9.223372e+18) & (long)uVar1 >> 0x3f) <= num_elts;
    }
    if (!bVar2) break;
    if (local_30 << 1 < local_30) {
      this_00 = (length_error *)__cxa_allocate_exception(0x10);
      std::length_error::length_error(this_00,"resize overflow");
      __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
    }
    local_30 = local_30 << 1;
  }
  return local_30;
}

Assistant:

size_type min_buckets(size_type num_elts, size_type min_buckets_wanted) {
    float enlarge = enlarge_factor();
    size_type sz = HT_MIN_BUCKETS;             // min buckets allowed
    while ( sz < min_buckets_wanted ||
            num_elts >= static_cast<size_type>(sz * enlarge) ) {
      // This just prevents overflowing size_type, since sz can exceed
      // max_size() here.
      if (static_cast<size_type>(sz * 2) < sz) {
        throw std::length_error("resize overflow");  // protect against overflow
      }
      sz *= 2;
    }
    return sz;
  }